

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

void __thiscall FIX::double_conversion::StringBuilder::TrimTrailingZeros(StringBuilder *this)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  int n;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar5 = this->position_;
  uVar4 = (ulong)uVar5;
  if (((int)uVar5 < 0) || ((this->buffer_).length_ <= (int)uVar5)) {
    __assert_fail("!is_finalized() && position_ < buffer_.length()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                  ,0x120,"void FIX::double_conversion::StringBuilder::TrimTrailingZeros()");
  }
  if (uVar5 != 0) {
    uVar10 = 0;
    do {
      iVar1 = (this->buffer_).length_;
      if ((long)iVar1 <= (long)uVar10) {
LAB_0016aec8:
        __assert_fail("0 <= index && index < length_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                      ,0xca,
                      "T &FIX::double_conversion::Vector<char>::operator[](int) const [T = char]");
      }
      pcVar2 = (this->buffer_).start_;
      if (pcVar2[uVar10] == '.') {
        iVar3 = (int)uVar4;
        uVar5 = iVar3 - 1;
        uVar8 = (ulong)(int)uVar5;
        uVar6 = (ulong)uVar5;
        if ((int)uVar10 < (int)uVar5) {
          uVar6 = uVar10 & 0xffffffff;
        }
        uVar5 = (uint)uVar6;
        n = 0;
        do {
          if ((long)uVar8 <= (long)uVar10) {
            n = 0;
            goto LAB_0016ae55;
          }
          if (iVar1 < iVar3) goto LAB_0016aec8;
          uVar9 = uVar8 & 0xffffffff;
          n = n + 1;
          uVar8 = uVar8 - 1;
        } while ((byte)(pcVar2[uVar9] | 0x20U) != 0x65);
        uVar5 = iVar3 - n;
        uVar4 = (ulong)uVar5;
        this->position_ = uVar5;
        uVar6 = (ulong)uVar5;
LAB_0016ae55:
        iVar3 = (int)uVar4;
        if (0 < iVar3) {
          uVar8 = uVar4 + 1;
          do {
            if (iVar1 < iVar3) goto LAB_0016aec8;
            if (pcVar2[uVar8 - 2] != '0') {
              uVar7 = (int)uVar4 - 1;
              if (pcVar2[uVar7] == '.') {
                this->position_ = uVar7;
                uVar4 = (ulong)uVar7;
              }
              break;
            }
            uVar7 = (int)uVar4 - 1;
            uVar4 = (ulong)uVar7;
            this->position_ = uVar7;
            uVar8 = uVar8 - 1;
          } while (1 < uVar8);
        }
        if (0 < n) {
          if (((int)(uVar5 + 1) < 1) || (iVar1 < (int)(uVar5 + 1))) goto LAB_0016aec8;
          AddSubstring(this,pcVar2 + uVar6,n);
          uVar4 = (ulong)(uint)this->position_;
        }
      }
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)(int)uVar4);
  }
  return;
}

Assistant:

bool is_finalized() const { return position_ < 0; }